

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uchar *puVar12;
  long in_FS_OFFSET;
  
  puVar4 = data;
  if (req_comp != img_n) {
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar10 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar9 = 0;
        uVar8 = 0;
        uVar6 = 0;
        do {
          if (iVar10 - 10U < 0x1a) {
            iVar11 = (int)uVar6 * x;
            pbVar7 = data + (uint)(iVar11 * img_n);
            switch(iVar10) {
            case 10:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  puVar4[lVar5 * 2 + uVar9] = data[lVar5 + uVar8];
                  puVar4[lVar5 * 2 + uVar9 + 1] = 0xff;
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                puVar12 = puVar4 + uVar9 + 2;
                lVar5 = 0;
                do {
                  uVar3 = data[lVar5 + uVar8];
                  *puVar12 = uVar3;
                  puVar12[-1] = uVar3;
                  puVar12[-2] = uVar3;
                  lVar5 = lVar5 + 1;
                  puVar12 = puVar12 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  uVar3 = data[lVar5 + uVar8];
                  puVar4[lVar5 * 4 + uVar9 + 2] = uVar3;
                  puVar4[lVar5 * 4 + uVar9 + 1] = uVar3;
                  puVar4[lVar5 * 4 + uVar9] = uVar3;
                  puVar4[lVar5 * 4 + uVar9 + 3] = 0xff;
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  puVar4[lVar5 + uVar9] = data[lVar5 * 2 + uVar8];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                puVar12 = puVar4 + uVar9 + 2;
                lVar5 = 0;
                do {
                  uVar3 = data[lVar5 * 2 + uVar8];
                  *puVar12 = uVar3;
                  puVar12[-1] = uVar3;
                  puVar12[-2] = uVar3;
                  lVar5 = lVar5 + 1;
                  puVar12 = puVar12 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  uVar3 = data[lVar5 * 2 + uVar8];
                  puVar4[lVar5 * 4 + uVar9 + 2] = uVar3;
                  puVar4[lVar5 * 4 + uVar9 + 1] = uVar3;
                  puVar4[lVar5 * 4 + uVar9] = uVar3;
                  puVar4[lVar5 * 4 + uVar9 + 3] = data[lVar5 * 2 + uVar8 + 1];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x19:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  bVar2 = pbVar7[2];
                  puVar4[lVar5 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)pbVar7[1] * 0x96 + (uint)*pbVar7 * 0x4d >> 8);
                  lVar5 = lVar5 + 1;
                  pbVar7 = pbVar7 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x1a:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  bVar2 = pbVar7[2];
                  puVar4[lVar5 * 2 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)pbVar7[1] * 0x96 + (uint)*pbVar7 * 0x4d >> 8);
                  puVar4[lVar5 * 2 + uVar9 + 1] = 0xff;
                  lVar5 = lVar5 + 1;
                  pbVar7 = pbVar7 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x1c:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  puVar4[lVar5 * 4 + uVar9] = *pbVar7;
                  puVar4[lVar5 * 4 + uVar9 + 1] = pbVar7[1];
                  puVar4[lVar5 * 4 + uVar9 + 2] = pbVar7[2];
                  puVar4[lVar5 * 4 + uVar9 + 3] = 0xff;
                  lVar5 = lVar5 + 1;
                  pbVar7 = pbVar7 + 3;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  bVar2 = data[lVar5 * 4 + uVar8 + 2];
                  puVar4[lVar5 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar5 * 4 + uVar8 + 1] * 0x96 +
                               (uint)data[lVar5 * 4 + uVar8] * 0x4d >> 8);
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar5 = 0;
                do {
                  bVar2 = data[lVar5 * 4 + uVar8 + 2];
                  puVar4[lVar5 * 2 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar5 * 4 + uVar8 + 1] * 0x96 +
                               (uint)data[lVar5 * 4 + uVar8] * 0x4d >> 8);
                  puVar4[lVar5 * 2 + uVar9 + 1] = data[lVar5 * 4 + uVar8 + 3];
                  lVar5 = lVar5 + 1;
                } while (x != (uint)lVar5);
              }
              break;
            case 0x23:
              if (-1 < iVar1) {
                puVar12 = puVar4 + (uint)(iVar11 * req_comp);
                lVar5 = 0;
                do {
                  *puVar12 = data[lVar5 * 4 + uVar8];
                  puVar12[1] = data[lVar5 * 4 + uVar8 + 1];
                  puVar12[2] = data[lVar5 * 4 + uVar8 + 2];
                  lVar5 = lVar5 + 1;
                  puVar12 = puVar12 + 3;
                } while (x != (uint)lVar5);
              }
            }
          }
          uVar6 = uVar6 + 1;
          uVar8 = (ulong)((int)uVar8 + x * img_n);
          uVar9 = (ulong)((int)uVar9 + x * req_comp);
        } while (uVar6 != y);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}